

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_constant.cpp
# Opt level: O1

bool duckdb::Transformer::ConstructConstantFromExpression(ParsedExpression *expr,Value *value)

{
  string *psVar1;
  ExpressionType EVar2;
  pointer puVar3;
  pointer pcVar4;
  element_type **ppeVar5;
  undefined8 uVar6;
  element_type *peVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  FunctionExpression *pFVar11;
  ConstantExpression *pCVar12;
  CastExpression *pCVar13;
  pointer pPVar14;
  const_reference pvVar15;
  type pPVar16;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *pvVar17;
  LogicalType *pLVar18;
  LogicalType *value_type;
  BinderException *this;
  ConversionException *this_00;
  Value *child_value_1;
  pointer puVar19;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar20;
  Value keys;
  child_list_t<Value> values_2;
  Value values;
  vector<duckdb::Value,_true> values_unpacked;
  vector<duckdb::Value,_true> keys_unpacked;
  Value local_270;
  Value *local_230;
  undefined1 local_228 [64];
  Value local_1e8;
  vector<duckdb::Value,_true> local_1a8;
  vector<duckdb::Value,_true> local_190;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_178;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_160;
  LogicalType local_148;
  vector<duckdb::Value,_true> local_130;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_108;
  LogicalType local_f0;
  LogicalType local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  LogicalType local_60;
  LogicalType local_48;
  
  EVar2 = (expr->super_BaseExpression).type;
  if (EVar2 == OPERATOR_CAST) {
    pCVar13 = BaseExpression::Cast<duckdb::CastExpression>(&expr->super_BaseExpression);
    LogicalType::LogicalType(&local_f0,SQLNULL);
    Value::Value(&local_270,&local_f0);
    LogicalType::~LogicalType(&local_f0);
    pPVar16 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(&pCVar13->child);
    bVar9 = ConstructConstantFromExpression(pPVar16,&local_270);
    if (bVar9) {
      ppeVar5 = (element_type **)
                &local_1e8.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_1e8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_1e8.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_1e8.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
           0xffffffffffffff00;
      local_1e8.type_._0_8_ = ppeVar5;
      bVar8 = Value::DefaultTryCastAs
                        (&local_270,&pCVar13->cast_type,value,(string *)&local_1e8,false);
      if (!bVar8) {
        this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
        local_228._0_8_ = local_228 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_228,"Unable to cast %s to %s","");
        Value::ToString_abi_cxx11_(&local_80,&local_270);
        EnumUtil::ToString<duckdb::LogicalTypeId>(&local_a0,(pCVar13->cast_type).id_);
        ConversionException::ConversionException<std::__cxx11::string,std::__cxx11::string>
                  (this_00,(string *)local_228,&local_80,&local_a0);
        __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((element_type **)local_1e8.type_._0_8_ != ppeVar5) {
        operator_delete((void *)local_1e8.type_._0_8_);
      }
    }
LAB_017abf43:
    Value::~Value(&local_270);
  }
  else {
    if (EVar2 == VALUE_CONSTANT) {
      pCVar12 = BaseExpression::Cast<duckdb::ConstantExpression>(&expr->super_BaseExpression);
      Value::operator=(value,&pCVar12->value);
      return true;
    }
    if (EVar2 == FUNCTION) {
      local_230 = value;
      pFVar11 = BaseExpression::Cast<duckdb::FunctionExpression>(&expr->super_BaseExpression);
      psVar1 = &pFVar11->function_name;
      iVar10 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar10 == 0) {
        local_1e8.type_._0_8_ = &local_1e8.value_info_;
        local_1e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&DAT_00000001;
        local_1e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1e8._24_8_ = 0;
        local_1e8.value_.integer = 0x3f800000;
        local_1e8.value_.hugeint.upper = 0;
        local_1e8.value_info_.internal.
        super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_228._0_8_ = (pointer)0x0;
        local_228._8_8_ = (pointer)0x0;
        local_228._16_8_ = (pointer)0x0;
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::reserve((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)local_228,
                  (long)(pFVar11->children).
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pFVar11->children).
                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3);
        puVar19 = (pFVar11->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (pFVar11->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar9 = puVar19 == puVar3;
        if (!bVar9) {
          do {
            pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->(puVar19);
            local_270.type_._0_8_ = &local_1e8;
            pVar20 = ::std::
                     _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                               ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)local_270.type_._0_8_,&(pPVar14->super_BaseExpression).alias,
                                &local_270);
            if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              this = (BinderException *)__cxa_allocate_exception(0x10);
              local_270.type_._0_8_ =
                   &local_270.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_270,"Duplicate struct entry name \"%s\"","");
              pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        ::operator->(puVar19);
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              pcVar4 = (pPVar14->super_BaseExpression).alias._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c0,pcVar4,
                         pcVar4 + (pPVar14->super_BaseExpression).alias._M_string_length);
              BinderException::BinderException<std::__cxx11::string>
                        (this,(string *)&local_270,&local_c0);
              __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            LogicalType::LogicalType(&local_48,SQLNULL);
            Value::Value(&local_270,&local_48);
            LogicalType::~LogicalType(&local_48);
            pPVar16 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(puVar19);
            bVar8 = ConstructConstantFromExpression(pPVar16,&local_270);
            if (!bVar8) {
              Value::~Value(&local_270);
              goto LAB_017ac467;
            }
            pPVar14 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->(puVar19);
            ::std::
            vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
            ::emplace_back<std::__cxx11::string_const&,duckdb::Value>
                      ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                        *)local_228,&(pPVar14->super_BaseExpression).alias,&local_270);
            Value::~Value(&local_270);
            if (!bVar8) goto LAB_017ac467;
            puVar19 = puVar19 + 1;
            bVar9 = puVar19 == puVar3;
          } while (!bVar9);
        }
        local_108.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_228._0_8_;
        local_108.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_228._8_8_;
        local_108.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_228._16_8_;
        local_228._0_8_ = (pointer)0x0;
        local_228._8_8_ = (pointer)0x0;
        local_228._16_8_ = (pointer)0x0;
        Value::STRUCT(&local_270,(child_list_t<Value> *)&local_108);
        Value::operator=(local_230,&local_270);
        Value::~Value(&local_270);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::~vector(&local_108);
LAB_017ac467:
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                   *)local_228);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)&local_1e8);
        return bVar9;
      }
      iVar10 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar10 == 0) {
        local_1e8.type_._0_8_ = (LogicalType *)0x0;
        local_1e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::reserve
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1e8,
                   (long)(pFVar11->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pFVar11->children).
                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        puVar19 = (pFVar11->children).
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (pFVar11->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar9 = puVar19 == puVar3;
        if (!bVar9) {
          do {
            LogicalType::LogicalType(&local_60,SQLNULL);
            Value::Value(&local_270,&local_60);
            LogicalType::~LogicalType(&local_60);
            pPVar16 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(puVar19);
            bVar8 = ConstructConstantFromExpression(pPVar16,&local_270);
            if (!bVar8) {
              Value::~Value(&local_270);
              goto LAB_017ac491;
            }
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1e8,
                       &local_270);
            Value::~Value(&local_270);
            if (!bVar8) goto LAB_017ac491;
            puVar19 = puVar19 + 1;
            bVar9 = puVar19 == puVar3;
          } while (!bVar9);
        }
        LogicalType::LogicalType((LogicalType *)local_228,SQLNULL);
        peVar7 = local_1e8.type_.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((element_type *)local_1e8.type_._0_8_ !=
            local_1e8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
          pLVar18 = (LogicalType *)local_1e8.type_._0_8_;
          do {
            LogicalType::ForceMaxLogicalType(&local_270.type_,(LogicalType *)local_228,pLVar18);
            uVar6 = local_270.type_._0_8_;
            local_228[0] = local_270.type_.id_;
            local_228[1] = local_270.type_.physical_type_;
            local_270.type_._0_8_ = uVar6;
            LogicalType::~LogicalType(&local_270.type_);
            pLVar18 = (LogicalType *)((long)(pLVar18 + 2) + 0x10);
          } while ((element_type *)pLVar18 != peVar7);
        }
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_130,
                   (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1e8);
        Value::LIST(&local_270,(LogicalType *)local_228,&local_130);
        Value::operator=(local_230,&local_270);
        Value::~Value(&local_270);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_130);
        LogicalType::~LogicalType((LogicalType *)local_228);
LAB_017ac491:
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1e8);
        return bVar9;
      }
      iVar10 = ::std::__cxx11::string::compare((char *)psVar1);
      if (iVar10 == 0) {
        LogicalType::LogicalType(&local_d8,SQLNULL);
        Value::Value(&local_270,&local_d8);
        LogicalType::~LogicalType(&local_d8);
        pvVar15 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[](&pFVar11->children,0);
        pPVar16 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar15);
        bVar9 = ConstructConstantFromExpression(pPVar16,&local_270);
        if (bVar9) {
          LogicalType::LogicalType(&local_148,SQLNULL);
          Value::Value(&local_1e8,&local_148);
          LogicalType::~LogicalType(&local_148);
          pvVar15 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[](&pFVar11->children,1);
          pPVar16 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(pvVar15);
          bVar9 = ConstructConstantFromExpression(pPVar16,&local_1e8);
          if (bVar9) {
            pvVar17 = &ListValue::GetChildren(&local_270)->
                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_160,pvVar17);
            pvVar17 = &ListValue::GetChildren(&local_1e8)->
                       super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_178,pvVar17);
            pLVar18 = ListType::GetChildType(&local_270.type_);
            value_type = ListType::GetChildType(&local_1e8.type_);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_190,
                       &local_160);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1a8,
                       &local_178);
            Value::MAP((Value *)local_228,pLVar18,value_type,&local_190,&local_1a8);
            Value::operator=(local_230,(Value *)local_228);
            Value::~Value((Value *)local_228);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1a8);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_190);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_178);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_160);
          }
          Value::~Value(&local_1e8);
        }
        else {
          bVar9 = false;
        }
        goto LAB_017abf43;
      }
    }
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool Transformer::ConstructConstantFromExpression(const ParsedExpression &expr, Value &value) {
	// We have to construct it like this because we don't have the ClientContext for binding/executing the expr here
	switch (expr.GetExpressionType()) {
	case ExpressionType::FUNCTION: {
		auto &function = expr.Cast<FunctionExpression>();
		if (function.function_name == "struct_pack") {
			unordered_set<string> unique_names;
			child_list_t<Value> values;
			values.reserve(function.children.size());
			for (const auto &child : function.children) {
				if (!unique_names.insert(child->GetAlias()).second) {
					throw BinderException("Duplicate struct entry name \"%s\"", child->GetAlias());
				}
				Value child_value;
				if (!ConstructConstantFromExpression(*child, child_value)) {
					return false;
				}
				values.emplace_back(child->GetAlias(), std::move(child_value));
			}
			value = Value::STRUCT(std::move(values));
			return true;
		} else if (function.function_name == "list_value") {
			vector<Value> values;
			values.reserve(function.children.size());
			for (const auto &child : function.children) {
				Value child_value;
				if (!ConstructConstantFromExpression(*child, child_value)) {
					return false;
				}
				values.emplace_back(std::move(child_value));
			}

			// figure out child type
			LogicalType child_type(LogicalTypeId::SQLNULL);
			for (auto &child_value : values) {
				child_type = LogicalType::ForceMaxLogicalType(child_type, child_value.type());
			}

			// finally create the list
			value = Value::LIST(child_type, values);
			return true;
		} else if (function.function_name == "map") {
			Value keys;
			if (!ConstructConstantFromExpression(*function.children[0], keys)) {
				return false;
			}

			Value values;
			if (!ConstructConstantFromExpression(*function.children[1], values)) {
				return false;
			}

			vector<Value> keys_unpacked = ListValue::GetChildren(keys);
			vector<Value> values_unpacked = ListValue::GetChildren(values);

			value = Value::MAP(ListType::GetChildType(keys.type()), ListType::GetChildType(values.type()),
			                   keys_unpacked, values_unpacked);
			return true;
		} else {
			return false;
		}
	}
	case ExpressionType::VALUE_CONSTANT: {
		auto &constant = expr.Cast<ConstantExpression>();
		value = constant.value;
		return true;
	}
	case ExpressionType::OPERATOR_CAST: {
		auto &cast = expr.Cast<CastExpression>();
		Value dummy_value;
		if (!ConstructConstantFromExpression(*cast.child, dummy_value)) {
			return false;
		}

		string error_message;
		if (!dummy_value.DefaultTryCastAs(cast.cast_type, value, &error_message)) {
			throw ConversionException("Unable to cast %s to %s", dummy_value.ToString(),
			                          EnumUtil::ToString(cast.cast_type.id()));
		}
		return true;
	}
	default:
		return false;
	}
}